

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> * __thiscall
udpdiscovery::Peer::ListDiscovered_abi_cxx11_
          (list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
           *__return_storage_ptr__,Peer *this)

{
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> local_38;
  undefined1 local_19;
  Peer *local_18;
  Peer *this_local;
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Peer *)__return_storage_ptr__;
  std::__cxx11::list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
  list(__return_storage_ptr__);
  if (this->env_ != (PeerEnvInterface *)0x0) {
    (*this->env_->_vptr_PeerEnvInterface[3])(&local_38);
    std::__cxx11::list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
    ::operator=(__return_storage_ptr__,&local_38);
    std::__cxx11::list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
    ::~list(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<DiscoveredPeer> Peer::ListDiscovered() const {
  std::list<DiscoveredPeer> result;
  if (env_) {
    result = env_->ListDiscovered();
  }
  return result;
}